

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void __thiscall deqp::egl::anon_unknown_1::ShadersOOB::setup(ShadersOOB *this)

{
  pointer pbVar1;
  ShaderType SVar2;
  GLuint *pGVar3;
  char *pcVar4;
  undefined1 auVar5 [8];
  GLenum GVar6;
  GLint GVar7;
  GLenum GVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar10;
  ostream *poVar11;
  pointer puVar12;
  TestError *pTVar13;
  char *pcVar14;
  Functions *gl;
  long lVar15;
  long lVar16;
  bool bVar17;
  string readWriteStatement;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> refValues;
  ostringstream shaderDecl;
  ostringstream shaderBody;
  ShaderProgram program;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_830 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  undefined1 local_800 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_7d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7c8 [2];
  long *local_7b8;
  long local_7b0;
  long local_7a8 [2];
  uint local_798;
  value_type local_790;
  long *local_770;
  long local_768;
  long local_760 [2];
  long *local_750;
  long local_748;
  long local_740 [2];
  Functions *local_730;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_728;
  long lStack_710;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_698;
  deUint32 local_680;
  undefined1 local_678 [24];
  undefined1 uStack_660;
  long *local_658;
  long local_650;
  long local_648 [2];
  undefined1 local_638 [8];
  pointer pVStack_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628 [6];
  ios_base local_5c8 [264];
  ProgramSources local_4c0;
  undefined1 local_3f0 [112];
  ios_base local_380 [264];
  undefined1 local_278 [376];
  ShaderProgram local_100;
  
  gl = (this->super_ContextReset).m_gl;
  if ((this->super_ContextReset).m_shaderType == SHADERTYPE_COMPUTE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"uniform highp int u_index;\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "\tuint groupNdx = size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n",0x4b)
    ;
    if (this->m_isLocalArray == true) {
      bVar17 = this->m_isRead;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"\thighp vec4 values = vec4(1.0f) * float(groupNdx);\n",0x33);
      pcVar14 = "\tsb_out.values[u_index] = values.x;\n";
      if (bVar17 != false) {
        pcVar14 = "\tsb_out.values.x = values[u_index];\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar14,0x24);
    }
    else {
      pcVar14 = "sb_in";
      bVar17 = this->m_isUBO != false;
      if (bVar17) {
        pcVar14 = "ub_in";
      }
      pcVar4 = "sb_in";
      if (bVar17) {
        pcVar4 = "ub_in";
      }
      local_638 = (undefined1  [8])local_628;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_638,pcVar14,pcVar4 + 5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f0,"layout(std140, binding = 1) ",0x1c);
      pcVar14 = "buffer";
      if ((ulong)this->m_isUBO != 0) {
        pcVar14 = "uniform";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f0,pcVar14,(ulong)this->m_isUBO | 6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," Input\n",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f0,"\thighp vec4 values;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"} ",2);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f0,(char *)local_638,(long)pVStack_630);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"];\n",3);
      if (this->m_isRead == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_800,"\tsb_out.values.x = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_638);
        plVar9 = (long *)std::__cxx11::string::append(local_800);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_800,"\tsb_out.values[u_index] = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_638);
        plVar9 = (long *)std::__cxx11::string::append(local_800);
      }
      local_728.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_728.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar1 = (pointer)(plVar9 + 2);
      if ((pointer)*plVar9 == pbVar1) {
        local_728.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar1->_M_dataplus)._M_p;
        lStack_710 = plVar9[3];
      }
      else {
        local_728.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar1->_M_dataplus)._M_p;
        local_728.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar9;
      }
      local_728.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar9[1];
      *plVar9 = (long)pbVar1;
      plVar9[1] = 0;
      *(undefined1 *)&(pbVar1->_M_dataplus)._M_p = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_800._4_4_,local_800._0_4_) != &local_7f0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_800._4_4_,local_800._0_4_),
                        local_7f0._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 (char *)local_728.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)local_728.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      if (local_728.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_728.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_728.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((local_728.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (local_638 != (undefined1  [8])local_628) {
        operator_delete((void *)local_638,(ulong)(local_628[0]._M_allocated_capacity + 1));
      }
    }
    local_678[0x10] = 0;
    stack0xfffffffffffff999 = 0;
    local_678._0_8_ = (pointer)0x0;
    local_678[8] = 0;
    local_678._9_7_ = 0;
    memset(&local_728,0,0xac);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"#version 310 es\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"layout(local_size_x = 1, local_size_y = 1) in;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"layout(binding = 0) buffer Output {\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"\thighp vec4 values;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"} sb_out;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"\n",1);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_638,(char *)local_840,(long)local_838);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"void main ()\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{\n",2);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_7b8,local_7b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
    std::ios_base::~ios_base(local_5c8);
    local_798 = 5;
    local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_790,local_820._M_dataplus._M_p,
               local_820._M_dataplus._M_p + local_820._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_728 + local_798,&local_790);
    lVar15 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_4c0.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar15),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_728.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar15));
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x90);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
              (&local_4c0.attribLocationBindings,&local_698);
    local_4c0.transformFeedbackBufferMode = local_680;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4c0.transformFeedbackVaryings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_678);
    local_4c0.separable = (bool)uStack_660;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_790._M_dataplus._M_p != &local_790.field_2) {
      operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != &local_820.field_2) {
      operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
    }
    if (local_7b8 != local_7a8) {
      operator_delete(local_7b8,local_7a8[0] + 1);
    }
    if (local_840 != local_830) {
      operator_delete(local_840,(ulong)(local_830[0]->_M_local_buf + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_678);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_698);
    lVar15 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_728.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar15));
      lVar15 = lVar15 + -0x18;
    } while (lVar15 != -0x18);
    goto LAB_00e5e0a6;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"uniform highp int u_index;\n",0x1b);
  if (this->m_isLocalArray == true) {
    bVar17 = this->m_isRead;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\thighp vec4 color_out = vec4(1.0f);\n",0x24);
    pcVar14 = "\tcolor[u_index] = color_out.x;\n";
    if (bVar17 != false) {
      pcVar14 = "\tcolor.x = color_out[u_index];\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar14,0x1f);
  }
  else {
    pcVar14 = "sb_in";
    bVar17 = this->m_isUBO != false;
    if (bVar17) {
      pcVar14 = "ub_in";
    }
    pcVar4 = "sb_in";
    if (bVar17) {
      pcVar4 = "ub_in";
    }
    local_638 = (undefined1  [8])local_628;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_638,pcVar14,pcVar4 + 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"layout(std140, binding = 0) ",0x1c);
    pcVar14 = "buffer";
    if ((ulong)this->m_isUBO != 0) {
      pcVar14 = "uniform";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,pcVar14,(ulong)this->m_isUBO | 6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," Block\n",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"\thighp vec4 color_out;\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"} ",2);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3f0,(char *)local_638,(long)pVStack_630);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"];\n",3);
    if (this->m_isRead == true) {
      std::operator+(&local_820,"\tcolor.x = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638)
      ;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_820);
    }
    else {
      std::operator+(&local_820,"\tcolor[u_index] = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638)
      ;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_820);
    }
    local_728.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_728.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar1 = (pointer)(plVar9 + 2);
    if ((pointer)*plVar9 == pbVar1) {
      local_728.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar1->_M_dataplus)._M_p;
      lStack_710 = plVar9[3];
    }
    else {
      local_728.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar1->_M_dataplus)._M_p;
      local_728.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar9;
    }
    local_728.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar9[1];
    *plVar9 = (long)pbVar1;
    plVar9[1] = 0;
    *(undefined1 *)&(pbVar1->_M_dataplus)._M_p = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != &local_820.field_2) {
      operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               (char *)local_728.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               (long)local_728.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
    if (local_728.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_728.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_728.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_728.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_638 != (undefined1  [8])local_628) {
      operator_delete((void *)local_638,(ulong)(local_628[0]._M_allocated_capacity + 1));
    }
  }
  local_678[0x10] = 0;
  stack0xfffffffffffff999 = 0;
  local_678._0_8_ = (pointer)0x0;
  local_678[8] = 0;
  local_678._9_7_ = 0;
  memset(&local_728,0,0xac);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  SVar2 = (this->super_ContextReset).m_shaderType;
  local_730 = gl;
  if (SVar2 == SHADERTYPE_VERT_AND_FRAG) {
LAB_00e5d5ba:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"#version 310 es\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"in highp vec4 a_position;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"out highp vec4 v_color;\n",0x18);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_638,(char *)local_7b8,local_7b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\thighp vec4 color;\n",0x13);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_658,local_650);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\tv_color = color;\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\tgl_Position = a_position;\n",0x1b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
    std::ios_base::~ios_base(local_5c8);
  }
  else if (SVar2 == SHADERTYPE_FRAG) {
    local_840 = local_830;
    local_638 = (undefined1  [8])&DAT_0000005a;
    ppaVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)std::__cxx11::string::_M_create((ulong *)&local_840,(ulong)local_638);
    auVar5 = local_638;
    local_830[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_638;
    local_840 = ppaVar10;
    memcpy(ppaVar10,
           "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
           ,0x5a);
    local_838 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)auVar5;
    *(char *)((long)ppaVar10 + (long)auVar5) = '\0';
  }
  else {
    if (SVar2 == SHADERTYPE_VERT) goto LAB_00e5d5ba;
    local_840 = local_830;
    local_838 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_830[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((ulong)local_830[0] & 0xffffffffffffff00);
  }
  local_798 = 0;
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_790,local_840,local_838->_M_local_buf + (long)local_840);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_728 + local_798,&local_790);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  SVar2 = (this->super_ContextReset).m_shaderType;
  if (SVar2 == SHADERTYPE_VERT_AND_FRAG) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"#version 310 es\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"in highp vec4 v_color;\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_638,"layout(location = 0) out highp vec4 fragColor;\n",0x2f);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_638,(char *)local_750,local_748);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\thighp vec4 color = vec4(0.0f);\n",0x20);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_770,local_768);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\tfragColor = color;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}\n",2);
    std::__cxx11::stringbuf::str();
LAB_00e5dac8:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
    std::ios_base::~ios_base(local_5c8);
  }
  else {
    if (SVar2 == SHADERTYPE_FRAG) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_638,"#version 310 es\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_638,"layout(location = 0) out highp vec4 fragColor;\n",0x2f);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_638,(char *)local_750,local_748);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"void main (void)\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"\thighp vec4 color = vec4(0.0f);\n",0x20);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(char *)local_770,local_768);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\tfragColor = color;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}\n",2);
      std::__cxx11::stringbuf::str();
      goto LAB_00e5dac8;
    }
    if (SVar2 == SHADERTYPE_VERT) {
      local_7d8 = local_7c8;
      local_638 = (undefined1  [8])0x81;
      ppaVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)std::__cxx11::string::_M_create((ulong *)&local_7d8,(ulong)local_638);
      auVar5 = local_638;
      local_7c8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_638;
      local_7d8 = ppaVar10;
      memcpy(ppaVar10,
             "#version 310 es\nin highp vec4 v_color;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,0x81);
      local_7d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auVar5;
      *(char *)((long)ppaVar10 + (long)auVar5) = '\0';
    }
    else {
      local_7d8 = local_7c8;
      local_7d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_7c8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((ulong)local_7c8[0] & 0xffffffffffffff00);
    }
  }
  local_800._0_4_ = 1;
  local_800._8_8_ = local_7f0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_800 + 8),local_7d8,local_7d0->_M_local_buf + (long)local_7d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_728 + (uint)local_800._0_4_,(value_type *)(local_800 + 8));
  lVar15 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_4c0.sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar15),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_728.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar15));
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&local_4c0.attribLocationBindings,&local_698);
  local_4c0.transformFeedbackBufferMode = local_680;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4c0.transformFeedbackVaryings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_678);
  local_4c0.separable = (bool)uStack_660;
  if ((char *)local_800._8_8_ != local_7f0._M_local_buf + 8) {
    operator_delete((void *)local_800._8_8_,local_7f0._8_8_ + 1);
  }
  gl = local_730;
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8,(ulong)(local_7c8[0]->_M_local_buf + 1));
  }
  if (local_770 != local_760) {
    operator_delete(local_770,local_760[0] + 1);
  }
  if (local_750 != local_740) {
    operator_delete(local_750,local_740[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  if (local_840 != local_830) {
    operator_delete(local_840,(ulong)(local_830[0]->_M_local_buf + 1));
  }
  if (local_658 != local_648) {
    operator_delete(local_658,local_648[0] + 1);
  }
  if (local_7b8 != local_7a8) {
    operator_delete(local_7b8,local_7a8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_678);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_698);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_728.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
LAB_00e5e0a6:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base((ios_base *)(local_278 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base(local_380);
  glu::ShaderProgram::ShaderProgram(&local_100,gl,&local_4c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c0.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_4c0.attribLocationBindings);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_4c0.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  glu::operator<<((this->super_ContextReset).m_log,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x50c);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_ContextReset).m_gl)->useProgram)(local_100.m_program.m_program);
  GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar6,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x50e);
  GVar7 = (*((this->super_ContextReset).m_gl)->getUniformLocation)
                    (local_100.m_program.m_program,"u_index");
  GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar6,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x511);
  if (GVar7 == -1) {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,(char *)0x0,"indexLocation != (glw::GLint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x512);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_ContextReset).m_gl)->uniform1i)(GVar7,-1);
  GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar6,"uniform1i(indexLocation, index)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x515);
  if ((this->super_ContextReset).m_shaderType != SHADERTYPE_COMPUTE) {
    local_628[0]._M_allocated_capacity = &DAT_3f8000003f800000;
    local_628[0]._8_8_ = 0x3f800000bf800000;
    local_638 = (undefined1  [8])0xbf800000bf800000;
    pVStack_630 = (pointer)0xbf8000003f800000;
    GVar7 = (*((this->super_ContextReset).m_gl)->getAttribLocation)
                      (local_100.m_program.m_program,"a_position");
    this->m_coordLocation = GVar7;
    GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar6,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x523);
    if (this->m_coordLocation == -1) {
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,(char *)0x0,"m_coordLocation != (glw::GLint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                 ,0x524);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this->m_coordinatesBuffer = 0;
    (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_coordinatesBuffer);
    GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar6,"genBuffers(1, &m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x528);
    (*((this->super_ContextReset).m_gl)->bindBuffer)(0x8892,this->m_coordinatesBuffer);
    GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar6,"bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x529);
    (*((this->super_ContextReset).m_gl)->bufferData)(0x8892,0x20,local_638,0x88e4);
    GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar6,
                    "bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x52a);
    (*((this->super_ContextReset).m_gl)->enableVertexAttribArray)(this->m_coordLocation);
    GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar6,"enableVertexAttribArray(m_coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x52b);
    (*((this->super_ContextReset).m_gl)->vertexAttribPointer)
              (this->m_coordLocation,2,0x1406,'\0',0,(void *)0x0);
    GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar6,"vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x52c);
  }
  local_3f0._0_8_ = (_func_int **)0x3f80000000000000;
  local_3f0._8_8_ = &DAT_3f8000003f800000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_638,3,
             (value_type *)local_3f0,(allocator_type *)local_278);
  GVar6 = 0x90d2;
  if (this->m_isUBO != false) {
    GVar6 = 0x8a11;
  }
  if (this->m_isLocalArray == false) {
    pGVar3 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (*((this->super_ContextReset).m_gl)->genBuffers)
              ((GLsizei)((ulong)((long)(this->m_buffers).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar3) >>
                        2),pGVar3);
    GVar8 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar8,"genBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x536);
    puVar12 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_buffers).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar12) >> 2)) {
      lVar15 = 0;
      lVar16 = 0;
      do {
        (*((this->super_ContextReset).m_gl)->bindBuffer)(GVar6,puVar12[lVar16]);
        GVar8 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar8,"bindBuffer(resType, m_buffers[bufNdx])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53a);
        (*((this->super_ContextReset).m_gl)->bufferData)
                  (GVar6,0x10,(char *)((long)local_638 + lVar15),0x88e4);
        GVar8 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar8,
                        "bufferData(resType, sizeof(tcu::Vec4), &(refValues[bufNdx]), GL_STATIC_DRAW)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53b);
        (*((this->super_ContextReset).m_gl)->bindBufferBase)
                  (GVar6,(GLuint)lVar16,
                   (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16]);
        GVar8 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar8,"bindBufferBase(resType, bufNdx, m_buffers[bufNdx])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x53c);
        lVar16 = lVar16 + 1;
        puVar12 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar15 = lVar15 + 0x10;
      } while (lVar16 < (int)((ulong)((long)(this->m_buffers).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar12) >> 2));
    }
  }
  if (local_638 != (undefined1  [8])0x0) {
    operator_delete((void *)local_638,local_628[0]._M_allocated_capacity - (long)local_638);
  }
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return;
}

Assistant:

void ShadersOOB::setup (void)
{
	glu::ShaderProgram program(m_gl, genSources());

	m_log << program;

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	const glw::GLint indexLocation = m_gl.getUniformLocation(program.getProgram(), "u_index");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(indexLocation != (glw::GLint)-1);

	const glw::GLint index = -1;
	GLU_CHECK_GLW_CALL(m_gl, uniform1i(indexLocation, index));

	if (m_shaderType != SHADERTYPE_COMPUTE)
	{
		const glw::GLfloat coords[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
			-1.0f, +1.0f
		};

		// Setup vertices position
		m_coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_position");
		GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
		TCU_CHECK(m_coordLocation != (glw::GLint)-1);

		// Load the vertex data
		m_coordinatesBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(m_coordLocation));
		GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL));
	}

	// Create dummy data for filling buffer objects
	const std::vector<tcu::Vec4> refValues(s_numBindings, tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f));
	glw::GLenum resType = (m_isUBO) ? GL_UNIFORM_BUFFER : GL_SHADER_STORAGE_BUFFER;

	if (!m_isLocalArray)
	{
		// Set up interface block of buffer bindings
		GLU_CHECK_GLW_CALL(m_gl, genBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0]));

		for (int bufNdx = 0; bufNdx < (int)m_buffers.size(); ++bufNdx)
		{
			GLU_CHECK_GLW_CALL(m_gl, bindBuffer(resType, m_buffers[bufNdx]));
			GLU_CHECK_GLW_CALL(m_gl, bufferData(resType, sizeof(tcu::Vec4), &(refValues[bufNdx]), GL_STATIC_DRAW));
			GLU_CHECK_GLW_CALL(m_gl, bindBufferBase(resType, bufNdx, m_buffers[bufNdx]));
		}
	}
}